

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmbstr.c
# Opt level: O2

int prvTidytmbstrcmp(ctmbstr s1,ctmbstr s2)

{
  char cVar1;
  long lVar2;
  
  lVar2 = 0;
  while( true ) {
    cVar1 = s1[lVar2];
    if (cVar1 != s2[lVar2]) {
      return (uint)(s2[lVar2] < cVar1) * 2 + -1;
    }
    if (cVar1 == '\0') break;
    lVar2 = lVar2 + 1;
  }
  return 0;
}

Assistant:

int TY_(tmbstrcmp)( ctmbstr s1, ctmbstr s2 )
{
    int c;
    while ((c = *s1) == *s2)
    {
        if (c == '\0')
            return 0;

        ++s1;
        ++s2;
    }

    return (*s1 > *s2 ? 1 : -1);
}